

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bytestring.h
# Opt level: O2

int OBJ_cbs2nid(CBS *cbs)

{
  int iVar1;
  ASN1_OBJECT obj;
  ASN1_OBJECT local_28;
  
  iVar1 = 0;
  if (cbs->len < 0x80000000) {
    local_28.flags = 0;
    local_28._36_4_ = 0;
    local_28.sn = (char *)0x0;
    local_28.ln = (char **)0x0;
    local_28.data = cbs->data;
    local_28._16_8_ = cbs->len << 0x20;
    iVar1 = OBJ_obj2nid(&local_28);
  }
  return iVar1;
}

Assistant:

OPENSSL_INLINE size_t CBS_len(const CBS *cbs) { return cbs->len; }